

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_extract_cpio_lz.c
# Opt level: O0

void test_extract_cpio_lz(void)

{
  wchar_t wVar1;
  int f;
  char *reffile;
  
  extract_reference_file("test_extract.cpio.lz");
  wVar1 = systemf("%s -it < %s >test.out 2>test.err",testprog,"test_extract.cpio.lz");
  if ((wVar1 != L'\0') && (wVar1 = canLzip(), wVar1 == L'\0')) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_extract_cpio_lz.c"
                   ,L'\x1b');
    test_skipping("It seems lzip is not supported on this platform");
    return;
  }
  wVar1 = systemf("%s -i < %s >test.out 2>test.err",testprog,"test_extract.cpio.lz");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_extract_cpio_lz.c"
                      ,L'\x12',0,"0",(long)wVar1,
                      "systemf(\"%s -i < %s >test.out 2>test.err\", testprog, reffile)",(void *)0x0)
  ;
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_extract_cpio_lz.c"
             ,L'\x14',"file1");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_extract_cpio_lz.c"
             ,L'\x15',"contents of file1.\n","file1");
  assertion_file_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_extract_cpio_lz.c"
             ,L'\x16',"file2");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_extract_cpio_lz.c"
             ,L'\x17',"contents of file2.\n","file2");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_extract_cpio_lz.c"
             ,L'\x18',"test.out");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_extract_cpio_lz.c"
             ,L'\x19',"1 block\n","test.err");
  return;
}

Assistant:

DEFINE_TEST(test_extract_cpio_lz)
{
	const char *reffile = "test_extract.cpio.lz";
	int f;

	extract_reference_file(reffile);
	f = systemf("%s -it < %s >test.out 2>test.err", testprog, reffile);
	if (f == 0 || canLzip()) {
		assertEqualInt(0, systemf("%s -i < %s >test.out 2>test.err",
		    testprog, reffile));

		assertFileExists("file1");
		assertTextFileContents("contents of file1.\n", "file1");
		assertFileExists("file2");
		assertTextFileContents("contents of file2.\n", "file2");
		assertEmptyFile("test.out");
		assertTextFileContents("1 block\n", "test.err");
	} else {
		skipping("It seems lzip is not supported on this platform");
	}
}